

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regcomp.c
# Opt level: O2

int onig_end(void)

{
  EndCallListItemType *__ptr;
  EndCallListItemType *pEVar1;
  
  pEVar1 = EndCallTop;
  while (pEVar1 != (EndCallListItemType *)0x0) {
    (*pEVar1->func)();
    __ptr = EndCallTop;
    pEVar1 = EndCallTop->next;
    EndCallTop = pEVar1;
    free(__ptr);
  }
  onig_global_callout_names_free();
  onigenc_end();
  onig_inited = 0;
  return 0;
}

Assistant:

static void
exec_end_call_list(void)
{
  EndCallListItemType* prev;
  void (*func)(void);

  while (EndCallTop != 0) {
    func = EndCallTop->func;
    (*func)();

    prev = EndCallTop;
    EndCallTop = EndCallTop->next;
    xfree(prev);
  }
}